

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcSymObjBase::add_sc_name_entry(CTcSymObjBase *this,char *txt,size_t len)

{
  textchar_t *sym;
  size_t in_RDI;
  CTPNSuperclass *entry;
  CTPNSuperclass *in_stack_ffffffffffffffd0;
  
  sym = (textchar_t *)CTcPrsAllocObj::operator_new(0x2af317);
  CTPNSuperclass::CTPNSuperclass(in_stack_ffffffffffffffd0,sym,in_RDI);
  if (*(long *)(in_RDI + 0x80) == 0) {
    *(textchar_t **)(in_RDI + 0x78) = sym;
  }
  else {
    *(textchar_t **)(*(long *)(in_RDI + 0x80) + 8) = sym;
  }
  *(textchar_t **)(in_RDI + 0x80) = sym;
  return;
}

Assistant:

void CTcSymObjBase::add_sc_name_entry(const char *txt, size_t len)
{
    /* create the entry object */
    CTPNSuperclass *entry = new CTPNSuperclass(txt, len);

    /* link it into our list */
    if (sc_name_tail_ != 0)
        sc_name_tail_->nxt_ = entry;
    else
        sc_name_head_ = entry;
    sc_name_tail_ = entry;
}